

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O0

CheckedError __thiscall flatbuffers::Parser::ParseProtoOption(Parser *this)

{
  bool bVar1;
  int in_ESI;
  Parser *this_local;
  CheckedError *ce;
  
  Next(this);
  bVar1 = CheckedError::Check((CheckedError *)this);
  if (!bVar1) {
    CheckedError::~CheckedError((CheckedError *)this);
    ParseProtoKey(this);
    bVar1 = CheckedError::Check((CheckedError *)this);
    if (!bVar1) {
      CheckedError::~CheckedError((CheckedError *)this);
      Expect(this,in_ESI);
      bVar1 = CheckedError::Check((CheckedError *)this);
      if (!bVar1) {
        CheckedError::~CheckedError((CheckedError *)this);
        ParseProtoCurliesOrIdent(this);
        bVar1 = CheckedError::Check((CheckedError *)this);
        if (!bVar1) {
          CheckedError::~CheckedError((CheckedError *)this);
          anon_unknown_0::NoError();
        }
      }
    }
  }
  return SUB82(this,0);
}

Assistant:

CheckedError Parser::ParseProtoOption() {
  NEXT();
  ECHECK(ParseProtoKey());
  EXPECT('=');
  ECHECK(ParseProtoCurliesOrIdent());
  return NoError();
}